

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O2

void sample_output<trng::yarn3s>(yarn3s *r,string *name)

{
  result_type rVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  
  while (name->_M_string_length < 0x20) {
    std::__cxx11::string::push_back((char)name);
  }
  std::operator<<((ostream *)&std::cout,(string *)name);
  iVar3 = 0xf;
  while( true ) {
    rVar1 = trng::yarn3s::operator()(r);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    std::operator<<(poVar2,'\t');
  }
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}